

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateRow(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int r,int lv,int prow,int pcol,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *pval,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  fpclass_type fVar5;
  fpclass_type fVar6;
  fpclass_type fVar7;
  pointer pnVar8;
  int32_t iVar13;
  int32_t iVar14;
  undefined8 uVar9;
  int32_t iVar15;
  Pring *pPVar10;
  Pring *pPVar11;
  Pring *pPVar12;
  int32_t iVar16;
  fpclass_type fVar17;
  int iVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int *piVar24;
  int *piVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  pointer pnVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  uint *puVar29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar30;
  undefined4 *puVar31;
  cpp_dec_float<200U,_int,_void> *pcVar32;
  pointer pnVar33;
  uint *puVar34;
  long lVar35;
  long lVar36;
  byte bVar37;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_348;
  int local_32c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [13];
  undefined3 uStack_2ab;
  int iStack_2a8;
  bool bStack_2a4;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  cpp_dec_float<200U,_int,_void> local_21c;
  cpp_dec_float<200U,_int,_void> local_19c;
  cpp_dec_float<200U,_int,_void> local_11c;
  uint local_9c [27];
  
  bVar37 = 0;
  local_238 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  piVar19 = (this->u).row.len;
  iVar3 = (this->u).row.start[r];
  iVar23 = piVar19[r];
  piVar19[r] = iVar23 + -1;
  local_32c = iVar23 + -1 + iVar3;
  lVar35 = (long)local_32c;
  lVar20 = lVar35 * 0x80 + 0x80;
  lVar21 = lVar35 * 4;
  do {
    lVar36 = lVar21;
    lVar22 = lVar20;
    lVar20 = lVar22 + -0x80;
    lVar21 = lVar36 + -4;
  } while (*(int *)((long)(this->u).row.idx + lVar36) != pcol);
  local_2a0._0_4_ = cpp_dec_float_finite;
  local_2a0._4_4_ = 0x1c;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2ab = 0;
  iStack_2a8 = 0;
  bStack_2a4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_318,
             (cpp_dec_float<200U,_int,_void> *)
             ((long)(this->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems + lVar22),
             &pval->m_backend);
  pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_318;
  pcVar26 = &local_11c;
  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
    (pcVar26->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
    pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar37 * -8 + 4);
    pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + ((ulong)bVar37 * -2 + 1) * 4);
  }
  local_11c.exp = iStack_2a8;
  local_11c.neg = bStack_2a4;
  local_11c.fpclass = (fpclass_type)local_2a0;
  local_11c.prec_elem = local_2a0._4_4_;
  pnVar8 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar28 = &local_11c;
  pnVar27 = pnVar8 + lv;
  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
    (pnVar27->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
    pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar37 * -2 + 1) * 4);
    pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar37 * -2 + 1) * 4);
  }
  pnVar8[lv].m_backend.exp = iStack_2a8;
  pnVar8[lv].m_backend.neg = bStack_2a4;
  pnVar8[lv].m_backend.fpclass = (fpclass_type)local_2a0;
  pnVar8[lv].m_backend.prec_elem = local_2a0._4_4_;
  (this->l).idx[lv] = r;
  piVar19 = (this->u).row.idx;
  *(int *)((long)piVar19 + lVar36) = piVar19[lVar35];
  pnVar8 = (this->u).row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar27 = pnVar8 + lVar35;
  puVar31 = (undefined4 *)((long)pnVar8[-1].m_backend.data._M_elems + lVar22);
  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
    *puVar31 = (pnVar27->m_backend).data._M_elems[0];
    pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar37 * -2 + 1) * 4);
    puVar31 = puVar31 + (ulong)bVar37 * -2 + 1;
  }
  *(int *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar22) = pnVar8[lVar35].m_backend.exp;
  *(bool *)((long)(&pnVar8[-1].m_backend.data + 1) + 4U + lVar22) = pnVar8[lVar35].m_backend.neg;
  *(undefined8 *)((long)(&pnVar8[-1].m_backend.data + 1) + 8U + lVar22) =
       *(undefined8 *)&pnVar8[lVar35].m_backend.fpclass;
  piVar19 = (this->u).row.len;
  local_348 = piVar19[prow];
  if (1 < iVar23) {
    do {
      piVar19 = (this->temp).s_mark;
      iVar23 = (this->u).row.idx[lVar35 + -1];
      lVar35 = lVar35 + -1;
      if (piVar19[iVar23] != 0) {
        piVar19[iVar23] = 0;
        pcVar28 = &this->work[iVar23].m_backend;
        local_2a0._0_4_ = cpp_dec_float_finite;
        local_2a0._4_4_ = 0x1c;
        local_318 = (undefined1  [16])0x0;
        local_308 = (undefined1  [16])0x0;
        local_2f8 = (undefined1  [16])0x0;
        local_2e8 = (undefined1  [16])0x0;
        local_2d8 = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_2b8 = SUB1613((undefined1  [16])0x0,0);
        uStack_2ab = 0;
        iStack_2a8 = 0;
        bStack_2a4 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_318 != pcVar28) {
          pcVar26 = pcVar28;
          pcVar32 = (cpp_dec_float<200U,_int,_void> *)local_318;
          for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
            (pcVar32->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar26->data)->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar37 * -8 + 4);
            pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar37 * -8 + 4);
          }
          iStack_2a8 = pcVar28->exp;
          bStack_2a4 = pcVar28->neg;
          local_2a0._0_4_ = pcVar28->fpclass;
          local_2a0._4_4_ = pcVar28->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_318,&local_11c);
        pnVar8 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&pnVar8[lVar35].m_backend,(cpp_dec_float<200U,_int,_void> *)local_318);
        pcVar28 = &pnVar8[lVar35].m_backend;
        puVar29 = (uint *)local_298;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar29 = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar37 * -8 + 4);
          puVar29 = puVar29 + (ulong)bVar37 * -2 + 1;
        }
        iVar18 = pnVar8[lVar35].m_backend.exp;
        bVar2 = pnVar8[lVar35].m_backend.neg;
        fVar5 = pnVar8[lVar35].m_backend.fpclass;
        iVar13 = pnVar8[lVar35].m_backend.prec_elem;
        puVar29 = (uint *)local_298;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_318;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          (pcVar28->data)._M_elems[0] = *puVar29;
          puVar29 = puVar29 + (ulong)bVar37 * -2 + 1;
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar37 * -8 + 4);
        }
        pnVar30 = eps;
        pcVar28 = &local_19c;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
          pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar30 + ((ulong)bVar37 * -2 + 1) * 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar37 * -2 + 1) * 4)
          ;
        }
        local_19c.exp = (eps->m_backend).exp;
        local_19c.neg = (eps->m_backend).neg;
        fVar6 = (eps->m_backend).fpclass;
        iVar14 = (eps->m_backend).prec_elem;
        local_19c.fpclass = fVar6;
        local_19c.prec_elem = iVar14;
        iStack_2a8 = iVar18;
        bStack_2a4 = bVar2;
        local_2a0._0_4_ = fVar5;
        local_2a0._4_4_ = iVar13;
        if ((bVar2 == true) && (local_318._0_4_ != 0 || fVar5 != cpp_dec_float_finite)) {
          bStack_2a4 = false;
        }
        local_348 = local_348 + -1;
        if ((fVar6 != cpp_dec_float_NaN && fVar5 != cpp_dec_float_NaN) &&
           (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_318,&local_19c), iVar18 < 1)
           ) {
          piVar19 = (this->u).row.len + r;
          *piVar19 = *piVar19 + -1;
          lVar20 = (long)local_32c + -1;
          pnVar8 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar27 = pnVar8 + lVar20;
          pnVar33 = pnVar8 + lVar35;
          for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
            (pnVar33->m_backend).data._M_elems[0] = (pnVar27->m_backend).data._M_elems[0];
            pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar37 * -2 + 1) * 4);
            pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar37 * -2 + 1) * 4);
          }
          pnVar8[lVar35].m_backend.exp = pnVar8[lVar20].m_backend.exp;
          pnVar8[lVar35].m_backend.neg = pnVar8[lVar20].m_backend.neg;
          iVar16 = pnVar8[lVar20].m_backend.prec_elem;
          pnVar8[lVar35].m_backend.fpclass = pnVar8[lVar20].m_backend.fpclass;
          pnVar8[lVar35].m_backend.prec_elem = iVar16;
          piVar19 = (this->u).row.idx;
          piVar19[lVar35] = piVar19[(long)local_32c + -1];
          piVar19 = (this->temp).s_cact + iVar23;
          *piVar19 = *piVar19 + -1;
          local_32c = local_32c + -1;
          piVar19 = (this->u).col.len;
          iVar18 = piVar19[iVar23] + -1;
          piVar19[iVar23] = iVar18;
          piVar19 = (this->u).col.idx;
          lVar20 = (long)(iVar18 + (this->u).col.start[iVar23]);
          piVar24 = piVar19 + lVar20 + 1;
          do {
            piVar25 = piVar24 + -1;
            piVar1 = piVar24 + -1;
            piVar24 = piVar25;
          } while (*piVar1 != r);
          *piVar25 = piVar19[lVar20];
        }
      }
    } while (iVar3 < lVar35);
    piVar19 = (this->u).row.len;
  }
  iVar3 = piVar19[r];
  local_348 = local_348 + iVar3;
  if ((this->u).row.max[r] < local_348) {
    remaxRow(this,r,local_348);
    piVar19 = (this->u).row.len;
  }
  if (0 < (long)piVar19[prow]) {
    piVar24 = (this->u).row.start;
    lVar20 = (long)piVar24[prow];
    lVar21 = piVar19[prow] + lVar20;
    local_348 = iVar3 + piVar24[r];
    do {
      piVar19 = (this->temp).s_mark;
      iVar3 = (this->u).row.idx[lVar20];
      if (piVar19[iVar3] == 0) {
        piVar19[iVar3] = 1;
      }
      else {
        pnVar30 = this->work + iVar3;
        uVar4 = (pnVar30->m_backend).data._M_elems[0];
        puVar29 = (pnVar30->m_backend).data._M_elems + 1;
        puVar34 = local_9c;
        for (lVar35 = 0x1b; lVar35 != 0; lVar35 = lVar35 + -1) {
          *puVar34 = *puVar29;
          puVar29 = puVar29 + (ulong)bVar37 * -2 + 1;
          puVar34 = puVar34 + (ulong)bVar37 * -2 + 1;
        }
        iVar23 = (pnVar30->m_backend).exp;
        uVar9._0_4_ = (pnVar30->m_backend).fpclass;
        uVar9._4_4_ = (pnVar30->m_backend).prec_elem;
        bVar2 = (pnVar30->m_backend).neg;
        local_318._0_4_ = uVar4;
        puVar29 = local_9c;
        puVar34 = (uint *)(local_318 + 4);
        for (lVar35 = 0x1b; lVar35 != 0; lVar35 = lVar35 + -1) {
          *puVar34 = *puVar29;
          puVar29 = puVar29 + (ulong)bVar37 * -2 + 1;
          puVar34 = puVar34 + (ulong)bVar37 * -2 + 1;
        }
        iStack_2a8 = iVar23;
        bStack_2a4 = (bool)((uVar4 != 0 || (fpclass_type)uVar9 != cpp_dec_float_finite) ^ bVar2);
        local_2a0 = uVar9;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_318,&local_11c);
        bVar2 = bStack_2a4;
        iVar23 = iStack_2a8;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_318;
        puVar29 = (uint *)local_298;
        for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
          *puVar29 = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar37 * -8 + 4);
          puVar29 = puVar29 + (ulong)bVar37 * -2 + 1;
        }
        fVar17 = (fpclass_type)local_2a0;
        iVar16 = local_2a0._4_4_;
        puVar29 = (uint *)local_298;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_318;
        for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
          (pcVar28->data)._M_elems[0] = *puVar29;
          puVar29 = puVar29 + (ulong)bVar37 * -2 + 1;
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar37 * -8 + 4);
        }
        pnVar30 = eps;
        pcVar28 = &local_21c;
        for (lVar35 = 0x1c; lVar35 != 0; lVar35 = lVar35 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar30->m_backend).data._M_elems[0];
          pnVar30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar30 + ((ulong)bVar37 * -2 + 1) * 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar37 * -2 + 1) * 4)
          ;
        }
        local_21c.exp = (eps->m_backend).exp;
        local_21c.neg = (eps->m_backend).neg;
        fVar7 = (eps->m_backend).fpclass;
        iVar15 = (eps->m_backend).prec_elem;
        local_21c.fpclass = fVar7;
        local_21c.prec_elem = iVar15;
        if ((bVar2 == true) && (local_318._0_4_ != 0 || fVar17 != cpp_dec_float_finite)) {
          bStack_2a4 = false;
        }
        if ((fVar7 != cpp_dec_float_NaN && fVar17 != cpp_dec_float_NaN) &&
           (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_318,&local_21c), 0 < iVar18)
           ) {
          lVar35 = (long)local_348;
          pnVar8 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar31 = (undefined4 *)local_298;
          pnVar27 = pnVar8 + lVar35;
          for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
            (pnVar27->m_backend).data._M_elems[0] = *puVar31;
            puVar31 = puVar31 + (ulong)bVar37 * -2 + 1;
            pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar37 * -2 + 1) * 4);
          }
          pnVar8[lVar35].m_backend.exp = iVar23;
          pnVar8[lVar35].m_backend.neg = bVar2;
          pnVar8[lVar35].m_backend.fpclass = fVar17;
          pnVar8[lVar35].m_backend.prec_elem = iVar16;
          (this->u).row.idx[lVar35] = iVar3;
          piVar19 = (this->u).row.len + r;
          *piVar19 = *piVar19 + 1;
          piVar19 = (this->u).col.len;
          iVar23 = piVar19[iVar3];
          if ((this->u).col.max[iVar3] <= iVar23) {
            remaxCol(this,iVar3,iVar23 + 1);
            piVar19 = (this->u).col.len;
            iVar23 = piVar19[iVar3];
          }
          local_348 = local_348 + 1;
          piVar24 = (this->u).col.idx;
          iVar18 = (this->u).col.start[iVar3];
          piVar19[iVar3] = iVar23 + 1;
          piVar24[(long)iVar23 + (long)iVar18] = r;
          piVar19 = (this->temp).s_cact + iVar3;
          *piVar19 = *piVar19 + 1;
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < lVar21);
    piVar19 = (this->u).row.len;
  }
  pPVar10 = (this->temp).pivot_row;
  pPVar11 = pPVar10[r].next;
  pPVar12 = pPVar10[r].prev;
  pPVar11->prev = pPVar12;
  pPVar12->next = pPVar11;
  pPVar11 = (this->temp).pivot_rowNZ;
  iVar3 = piVar19[r];
  pPVar12 = pPVar11[iVar3].next;
  pPVar10[r].next = pPVar12;
  pPVar12->prev = pPVar10 + r;
  pPVar10[r].prev = pPVar11 + iVar3;
  pPVar11[iVar3].next = pPVar10 + r;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->temp).s_max.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[r].m_backend,-1);
  return lv + 1;
}

Assistant:

int CLUFactor<R>::updateRow(int r,
                            int lv,
                            int prow,
                            int pcol,
                            R pval,
                            R eps)
{
   int fill;
   R x, lx;
   int c, i, j, k, ll, m, n;

   n = u.row.start[r];
   m = --(u.row.len[r]) + n;

   /*  compute L VectorBase<R> entry and
    *  and remove pivot column form row file
    */

   for(j = m; u.row.idx[j] != pcol; --j)
      ;

   lx = u.row.val[j] / pval;

   l.val[lv] = lx;

   l.idx[lv] = r;

   ++lv;

   u.row.idx[j] = u.row.idx[m];

   u.row.val[j] = u.row.val[m];


   /*  update loop (I) and
    *  computing expected fill
    */
   fill = u.row.len[prow];

   for(j = m - 1; j >= n; --j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         /*  count fill elements.
          */
         temp.s_mark[c] = 0;
         --fill;

         /*  update row values
          */
         x = u.row.val[j] -= work[c] * lx;

         if(isZero(x, eps))
         {
            /* Eliminate zero from row r
             */
            --u.row.len[r];
            --m;
            u.row.val[j] = u.row.val[m];
            u.row.idx[j] = u.row.idx[m];

            /* Eliminate zero from column c
             */
            --(temp.s_cact[c]);
            k = --(u.col.len[c]) + u.col.start[c];

            for(i = k; u.col.idx[i] != r; --i)
               ;

            u.col.idx[i] = u.col.idx[k];
         }
      }
   }


   /*  create space for fill in row file
    */
   ll = u.row.len[r];

   if(ll + fill > u.row.max[r])
      remaxRow(r, ll + fill);

   ll += u.row.start[r];

   /*  fill creating update loop (II)
    */
   for(j = u.row.start[prow], m = j + u.row.len[prow]; j < m; ++j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         x = - work[c] * lx;

         if(isNotZero(x, eps))
         {
            /* produce fill element in row r
             */
            u.row.val[ll] = x;
            u.row.idx[ll] = c;
            ll++;
            u.row.len[r]++;

            /* produce fill element in column c
             */

            if(u.col.len[c] >= u.col.max[c])
               remaxCol(c, u.col.len[c] + 1);

            u.col.idx[u.col.start[c] + (u.col.len[c])++] = r;

            temp.s_cact[c]++;
         }
      }
      else
         temp.s_mark[c] = 1;
   }

   /*  move row to appropriate list.
    */
   removeDR(temp.pivot_row[r]);

   init2DR(temp.pivot_row[r], temp.pivot_rowNZ[u.row.len[r]]);

   assert(row.perm[r] < 0);

   temp.s_max[r] = -1;

   return lv;
}